

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O1

uint32_t generateBucketId(string *typeName)

{
  int iVar1;
  long lVar2;
  string local_e0;
  stat local_c0;
  
  do {
    lVar2 = random();
    generateBucketFileName(&local_e0,typeName,(uint32_t)lVar2);
    iVar1 = stat(local_e0._M_dataplus._M_p,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  } while (iVar1 == 0);
  return (uint32_t)lVar2;
}

Assistant:

uint32_t generateBucketId(string &typeName) {

    bool file_exist;

    uint32_t postfix;

    do {
        postfix = random();

        file_exist = checkFileExist(generateBucketFileName(typeName, postfix));

    } while(file_exist);

    return postfix;
}